

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O2

void webrtc::FilterFar(int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
                      float (*h_fft_buf) [2080],float (*y_fft) [65])

{
  float *pfVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  pfVar1 = h_fft_buf[1];
  uVar4 = 0;
  if (0 < num_partitions) {
    uVar4 = (ulong)(uint)num_partitions;
  }
  iVar5 = x_fft_buf_block_pos * 0x41;
  for (uVar2 = 0; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    iVar3 = num_partitions * -0x41;
    if ((long)(uVar2 + (long)x_fft_buf_block_pos) < (long)num_partitions) {
      iVar3 = 0;
    }
    iVar3 = iVar3 + iVar5;
    for (lVar6 = 0; lVar6 != 0x41; lVar6 = lVar6 + 1) {
      (*y_fft)[lVar6] =
           ((*x_fft_buf)[iVar3 + lVar6] * pfVar1[lVar6 + -0x820] -
           pfVar1[lVar6] * x_fft_buf[1][iVar3 + lVar6]) + (*y_fft)[lVar6];
      y_fft[1][lVar6] =
           (*x_fft_buf)[iVar3 + lVar6] * pfVar1[lVar6] +
           x_fft_buf[1][iVar3 + lVar6] * pfVar1[lVar6 + -0x820] + y_fft[1][lVar6];
    }
    iVar5 = iVar5 + 0x41;
    pfVar1 = pfVar1 + 0x41;
  }
  return;
}

Assistant:

static void FilterFar(int num_partitions,
                      int x_fft_buf_block_pos,
                      float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float y_fft[2][PART_LEN1]) {
  int i;
  for (i = 0; i < num_partitions; i++) {
    int j;
    int xPos = (i + x_fft_buf_block_pos) * PART_LEN1;
    int pos = i * PART_LEN1;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * (PART_LEN1);
    }

    for (j = 0; j < PART_LEN1; j++) {
      y_fft[0][j] += MulRe(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
      y_fft[1][j] += MulIm(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
    }
  }
}